

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void encode_nonrd_sb(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
                    int mi_row,int mi_col,int seg_skip)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  AV1_COMP *cpi_00;
  TileInfo *in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_0000002c;
  TokenExtra **in_stack_00000030;
  int idx_in_sb;
  int c;
  int r;
  int block64_in_sb;
  BLOCK_SIZE bsize;
  BLOCK_SIZE bsize_select;
  PC_TREE *pc_root;
  AV1_COMP *in_stack_00000050;
  BLOCK_SIZE sb_size;
  MB_MODE_INFO **mi;
  TileInfo *tile_info;
  SPEED_FEATURES *sf;
  MACROBLOCK *x;
  AV1_COMMON *cm;
  int in_stack_000002b0;
  int in_stack_000002b4;
  MACROBLOCK *in_stack_000002b8;
  ThreadData_conflict *in_stack_000002c0;
  TileInfo *in_stack_000002c8;
  AV1_COMP *in_stack_000002d0;
  int local_70;
  undefined4 in_stack_ffffffffffffff94;
  BLOCK_SIZE bsize_00;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  MACROBLOCK *x_00;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char cVar5;
  AV1_COMP *cpi_01;
  
  bsize_00 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff94 >> 0x18);
  cpi_01 = (AV1_COMP *)(in_RDI + 0xc118);
  lVar1 = in_RDI[0x7837];
  iVar2 = get_mi_grid_idx((CommonModeInfoParams *)(in_RDI + 0x7831),in_R8D,in_R9D);
  cpi_00 = (AV1_COMP *)(lVar1 + (long)iVar2 * 8);
  iVar2 = CONCAT13(*(undefined1 *)(in_RDI[0x8401] + 0x1c),(int3)in_stack_ffffffffffffffac);
  x_00 = *(MACROBLOCK **)(in_RSI + 0x26e50);
  if ((((char)(cpi_01->enc_quant_dequant_params).quants.y_quant[8][0] == '\x01') ||
      (in_stack_00000008 != 0)) ||
     (((*(int *)(cpi_01->enc_quant_dequant_params).quants.y_quant[0x49] != 0 &&
       ((*(int *)(in_RSI + 0x2565c) == 1 &&
        (iVar3 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0)), iVar3 == 0)))) &&
      ((*(int *)(*in_RDI + 0xc750) == 0 ||
       (*(int *)(in_RDI[0x13a91] + (long)*(int *)((long)in_RDI + 0x9d334) * 0x3380 + 0x3378) == 0)))
      ))) {
    av1_set_offsets(cpi_00,(TileInfo *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),x_00,
                    in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,bsize_00);
    if ((((int)in_RDI[0xc1bd] != 0) && ((int)in_RDI[0xc0f6] != 0)) &&
       (*(int *)(*in_RDI + 0x14dc4) != 0)) {
      *(undefined4 *)(in_RSI + 0x15240) = 1;
    }
    if (*(int *)(in_RSI + 0x15d60) != 0) {
      *(undefined4 *)(in_RSI + 0x25634) = 1;
    }
    av1_set_fixed_partitioning
              (cpi_01,in_RDX,(MB_MODE_INFO **)cpi_00,iVar2,in_stack_ffffffffffffffa8,
               (BLOCK_SIZE)((ulong)x_00 >> 0x38));
    cVar5 = (char)((uint)iVar2 >> 0x18);
  }
  else {
    if ((char)(cpi_01->enc_quant_dequant_params).quants.y_quant[8][0] == '\x02') {
      av1_set_offsets(cpi_00,(TileInfo *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),x_00,
                      in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,bsize_00);
      av1_choose_var_based_partitioning
                (in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,
                 in_stack_000002b4,in_stack_000002b0);
    }
    cVar5 = (char)((uint)iVar2 >> 0x18);
  }
  set_cb_offsets((uint16_t *)(in_RSI + 0x4198),0,0);
  if (*(int *)(cpi_01->enc_quant_dequant_params).quants.y_quant[0x48] != 0) {
    iVar2 = 1;
    if (cVar5 == '\x0f') {
      iVar2 = 2;
    }
    for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
      for (local_70 = 0; local_70 < iVar2; local_70 = local_70 + 1) {
        iVar4 = iVar3 * 0x10 * *(int *)((long)in_RDI + 0x3c1c4) + local_70 * 0x10;
        if (*(long *)((long)((cpi_00->enc_quant_dequant_params).quants.y_quant + -1) +
                     (long)iVar4 * 8) != 0) {
          lVar1 = *(long *)((long)((cpi_00->enc_quant_dequant_params).quants.y_quant + -1) +
                           (long)iVar4 * 8);
          *(ushort *)(lVar1 + 0xa7) = *(ushort *)(lVar1 + 0xa7) & 0x87ff | 0x800;
        }
      }
    }
  }
  av1_nonrd_use_partition
            (in_stack_00000050,(ThreadData_conflict *)pc_root,_block64_in_sb,_c,in_stack_00000030,
             in_stack_0000002c,mi_col,(BLOCK_SIZE)tp,(PC_TREE *)tile_data);
  return;
}

Assistant:

static inline void encode_nonrd_sb(AV1_COMP *cpi, ThreadData *td,
                                   TileDataEnc *tile_data, TokenExtra **tp,
                                   const int mi_row, const int mi_col,
                                   const int seg_skip) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &td->mb;
  const SPEED_FEATURES *const sf = &cpi->sf;
  const TileInfo *const tile_info = &tile_data->tile_info;
  MB_MODE_INFO **mi = cm->mi_params.mi_grid_base +
                      get_mi_grid_idx(&cm->mi_params, mi_row, mi_col);
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;
  PC_TREE *const pc_root = td->pc_root;

#if CONFIG_RT_ML_PARTITIONING
  if (sf->part_sf.partition_search_type == ML_BASED_PARTITION) {
    RD_STATS dummy_rdc;
    get_estimated_pred(cpi, tile_info, x, mi_row, mi_col);
    av1_nonrd_pick_partition(cpi, td, tile_data, tp, mi_row, mi_col,
                             BLOCK_64X64, &dummy_rdc, 1, INT64_MAX, pc_root);
    return;
  }
#endif
  // Set the partition
  if (sf->part_sf.partition_search_type == FIXED_PARTITION || seg_skip ||
      (sf->rt_sf.use_fast_fixed_part && x->sb_force_fixed_part == 1 &&
       (!frame_is_intra_only(cm) &&
        (!cpi->ppi->use_svc ||
         !cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame)))) {
    // set a fixed-size partition
    av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, sb_size);
    BLOCK_SIZE bsize_select = sf->part_sf.fixed_partition_size;
    if (sf->rt_sf.use_fast_fixed_part &&
        x->content_state_sb.source_sad_nonrd < kLowSad) {
      bsize_select = cm->seq_params->sb_size;
    }
    if (cpi->sf.rt_sf.skip_encoding_non_reference_slide_change &&
        cpi->rc.high_source_sad && cpi->ppi->rtc_ref.non_reference_frame) {
      bsize_select = cm->seq_params->sb_size;
      x->force_zeromv_skip_for_sb = 1;
    }
    const BLOCK_SIZE bsize = seg_skip ? sb_size : bsize_select;
    if (x->content_state_sb.source_sad_nonrd > kZeroSad)
      x->force_color_check_block_level = 1;
    av1_set_fixed_partitioning(cpi, tile_info, mi, mi_row, mi_col, bsize);
  } else if (sf->part_sf.partition_search_type == VAR_BASED_PARTITION) {
    // set a variance-based partition
    av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, sb_size);
    av1_choose_var_based_partitioning(cpi, tile_info, td, x, mi_row, mi_col);
  }
  assert(sf->part_sf.partition_search_type == FIXED_PARTITION || seg_skip ||
         sf->part_sf.partition_search_type == VAR_BASED_PARTITION);
  set_cb_offsets(td->mb.cb_offset, 0, 0);

  // Initialize the flag to skip cdef to 1.
  if (sf->rt_sf.skip_cdef_sb) {
    const int block64_in_sb = (sb_size == BLOCK_128X128) ? 2 : 1;
    // If 128x128 block is used, we need to set the flag for all 4 64x64 sub
    // "blocks".
    for (int r = 0; r < block64_in_sb; ++r) {
      for (int c = 0; c < block64_in_sb; ++c) {
        const int idx_in_sb =
            r * MI_SIZE_64X64 * cm->mi_params.mi_stride + c * MI_SIZE_64X64;
        if (mi[idx_in_sb]) mi[idx_in_sb]->cdef_strength = 1;
      }
    }
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, nonrd_use_partition_time);
#endif
  av1_nonrd_use_partition(cpi, td, tile_data, mi, tp, mi_row, mi_col, sb_size,
                          pc_root);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, nonrd_use_partition_time);
#endif
}